

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casCore.c
# Opt level: O1

DdNode * GetSingleOutputFunction
                   (DdManager *dd,DdNode **pbOuts,int nOuts,DdNode **pbVarsEnc,int nVarsEnc,
                   int fVerbose)

{
  int iVar1;
  uint uVar2;
  DdNode *n;
  DdNode *pDVar3;
  DdNode *pDVar4;
  ulong uVar5;
  int *piVar6;
  int Order [1024];
  int local_1038 [1026];
  
  if (0 < nOuts) {
    piVar6 = s_SuppSize;
    uVar5 = 0;
    do {
      iVar1 = Cudd_SupportSize(dd,pbOuts[uVar5]);
      *piVar6 = iVar1;
      local_1038[uVar5] = (int)uVar5;
      uVar5 = uVar5 + 1;
      piVar6 = piVar6 + 1;
    } while ((uint)nOuts != uVar5);
  }
  qsort(local_1038,(long)nOuts,4,CompareSupports);
  pDVar4 = (DdNode *)((ulong)dd->one ^ 1);
  Cudd_Ref(pDVar4);
  if (0 < nOuts) {
    uVar5 = 0;
    pDVar3 = pDVar4;
    do {
      pDVar4 = Extra_bddBitsToCube(dd,(int)uVar5,nVarsEnc,pbVarsEnc,1);
      Cudd_Ref(pDVar4);
      n = Cudd_bddAnd(dd,pDVar4,pbOuts[local_1038[uVar5]]);
      Cudd_Ref(n);
      Cudd_RecursiveDeref(dd,pDVar4);
      pDVar4 = Cudd_bddOr(dd,n,pDVar3);
      Cudd_Ref(pDVar4);
      Cudd_RecursiveDeref(dd,pDVar3);
      Cudd_RecursiveDeref(dd,n);
      uVar5 = uVar5 + 1;
      pDVar3 = pDVar4;
    } while ((uint)nOuts != uVar5);
  }
  if (fVerbose != 0) {
    uVar2 = Cudd_DagSize(pDVar4);
    printf("Single BDD size = %6d nodes\n",(ulong)uVar2);
  }
  pDVar3 = Cudd_BddToAdd(dd,pDVar4);
  Cudd_Ref(pDVar3);
  Cudd_RecursiveDeref(dd,pDVar4);
  if (fVerbose != 0) {
    uVar2 = Cudd_DagSize(pDVar3);
    printf("MTBDD           = %6d nodes\n",(ulong)uVar2);
  }
  Cudd_Deref(pDVar3);
  return pDVar3;
}

Assistant:

DdNode * GetSingleOutputFunction( DdManager * dd, DdNode ** pbOuts, int nOuts, DdNode ** pbVarsEnc, int nVarsEnc, int fVerbose )
{
    int i;
    DdNode * bResult, * aResult;
    DdNode * bCube, * bTemp, * bProd;

    int Order[MAXOUTPUTS];
//  int OrderMint[MAXOUTPUTS];
 
    // sort the output according to their support size
    for ( i = 0; i < nOuts; i++ )
    {
        s_SuppSize[i] = Cudd_SupportSize( dd, pbOuts[i] );
//      s_MintOnes[i] = BitCount8[i];
        Order[i]      = i;
//      OrderMint[i]  = i;
    }
    
    // order the outputs
    qsort( (void*)Order,     (size_t)nOuts, sizeof(int), (int(*)(const void*, const void*)) CompareSupports );
    // order the outputs
//  qsort( (void*)OrderMint, (size_t)nOuts, sizeof(int), (int(*)(const void*, const void*)) CompareMinterms );


    bResult = b0;   Cudd_Ref( bResult );
    for ( i = 0; i < nOuts; i++ )
    {
//      bCube   = Cudd_bddBitsToCube( dd, OrderMint[i], nVarsEnc, pbVarsEnc );   Cudd_Ref( bCube );
//      bProd   = Cudd_bddAnd( dd, bCube, pbOuts[Order[nOuts-1-i]] );         Cudd_Ref( bProd );
        bCube   = Extra_bddBitsToCube( dd, i, nVarsEnc, pbVarsEnc, 1 );   Cudd_Ref( bCube );
        bProd   = Cudd_bddAnd( dd, bCube, pbOuts[Order[i]] );         Cudd_Ref( bProd );
        Cudd_RecursiveDeref( dd, bCube );

        bResult = Cudd_bddOr( dd, bProd, bTemp = bResult );           Cudd_Ref( bResult );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }

    // convert to the ADD
if ( fVerbose )
printf( "Single BDD size = %6d nodes\n", Cudd_DagSize(bResult) );
    aResult = Cudd_BddToAdd( dd, bResult );  Cudd_Ref( aResult );
    Cudd_RecursiveDeref( dd, bResult );
if ( fVerbose )
printf( "MTBDD           = %6d nodes\n", Cudd_DagSize(aResult) );
    Cudd_Deref( aResult );
    return aResult;
}